

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

double __thiscall phyr::Sphere::pdf(Sphere *this,Interaction *ref,Vector3f *wi)

{
  double *pdVar1;
  Point3f *in_RDX;
  Point3<double> *in_RSI;
  long in_RDI;
  double dVar2;
  double cosThetaMax;
  double sinThetaMax2;
  Point3f pOrigin;
  Point3f pCenter;
  Vector3f *in_stack_00000168;
  Interaction *in_stack_00000170;
  Shape *in_stack_00000178;
  Point3<double> *in_stack_ffffffffffffff38;
  Point3<double> *this_00;
  Point3<double> *p1;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  Point3<double> *in_stack_ffffffffffffff88;
  Transform *in_stack_ffffffffffffff90;
  Point3<double> local_50;
  Vector3f *in_stack_ffffffffffffffc8;
  Vector3f *in_stack_ffffffffffffffd0;
  Normal3f *in_stack_ffffffffffffffd8;
  double local_8;
  
  this_00 = *(Point3<double> **)(in_RDI + 8);
  Point3<double>::Point3(&local_50,0.0,0.0,0.0);
  Transform::operator()(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  p1 = in_RSI + 1;
  Point3<double>::operator-(this_00,in_stack_ffffffffffffff38);
  offsetRayOrigin(in_RDX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                  in_stack_ffffffffffffffc8);
  dVar2 = distanceSquared<double>(p1,in_RSI);
  if (*(double *)(in_RDI + 0x20) * *(double *)(in_RDI + 0x20) < dVar2) {
    dVar2 = *(double *)(in_RDI + 0x20) * *(double *)(in_RDI + 0x20);
    local_88 = distanceSquared<double>(p1,in_RSI);
    local_88 = dVar2 / local_88;
    local_98 = 0.0;
    local_a0 = 1.0 - local_88;
    pdVar1 = std::max<double>(&local_98,&local_a0);
    local_90 = sqrt(*pdVar1);
    local_8 = uniformConePdf(local_90);
  }
  else {
    local_8 = Shape::pdf(in_stack_00000178,in_stack_00000170,in_stack_00000168);
  }
  return local_8;
}

Assistant:

Real Sphere::pdf(const Interaction& ref, const Vector3f& wi) const {
    Point3f pCenter = (*localToWorld)(Point3f(0, 0, 0));
    // Return uniform PDF if point is inside sphere
    Point3f pOrigin =
        offsetRayOrigin(ref.p, ref.n, pCenter - ref.p, ref.pfError);
    if (distanceSquared(pOrigin, pCenter) <= radius * radius)
        return Shape::pdf(ref, wi);

    // Compute general sphere PDF
    Real sinThetaMax2 = radius * radius / distanceSquared(ref.p, pCenter);
    Real cosThetaMax = std::sqrt(std::max((Real)0, 1 - sinThetaMax2));
    return uniformConePdf(cosThetaMax);
}